

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::DirectStateAccess::Textures::ParameterErrorsTest::iterate(ParameterErrorsTest *this)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  ContextInfo *this_00;
  uint local_104;
  GLuint i;
  bool is_valid;
  GLuint all_pnames_count;
  GLenum all_pnames [29];
  undefined8 uStack_78;
  GLuint storeu [4];
  GLint storei [4];
  GLfloat storef [4];
  GLenum local_40;
  int local_3c;
  GLenum pname_invalid;
  GLuint texture_invalid;
  GLuint texture_buffer;
  GLuint texture_2D;
  bool is_error;
  bool is_ok;
  ApiType AStack_28;
  bool is_arb_direct_state_access;
  byte local_21;
  long lStack_20;
  bool is_at_least_gl_45;
  Functions *gl;
  ParameterErrorsTest *this_local;
  
  gl = (Functions *)this;
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar5->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar3);
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  AStack_28.m_bits = (*pRVar5->_vptr_RenderContext[2])();
  texture_2D = (GLuint)glu::ApiType::core(4,5);
  local_21 = glu::contextSupports((ContextType)AStack_28.m_bits,(ApiType)texture_2D);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  texture_buffer._3_1_ =
       glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_direct_state_access");
  if (((local_21 & 1) != 0) || ((bool)texture_buffer._3_1_)) {
    texture_buffer._2_1_ = 1;
    texture_buffer._1_1_ = 0;
    texture_invalid = 0;
    pname_invalid = 0;
    local_3c = 0;
    local_40 = 0;
    storei[2] = 0;
    storei[3] = 0;
    storeu[2] = 0;
    storeu[3] = 0;
    storei[0] = 0;
    storei[1] = 0;
    uStack_78 = 0;
    storeu[0] = 0;
    storeu[1] = 0;
    (**(code **)(lStack_20 + 0x400))(0xde1,1,&texture_invalid);
    dVar4 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar4,"glGenTextures has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x331e);
    (**(code **)(lStack_20 + 0x400))(0x8c2a,1,&pname_invalid);
    dVar4 = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(dVar4,"glGenTextures has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                    ,0x3322);
    do {
      local_3c = local_3c + 1;
      cVar1 = (**(code **)(lStack_20 + 0xcc8))();
    } while (cVar1 != '\0');
    memcpy(&stack0xffffffffffffff08,&DAT_02a7a680,0x74);
    bVar2 = true;
LAB_012378ab:
    if (bVar2) {
      bVar2 = false;
      local_40 = local_40 + 1;
      for (local_104 = 0; local_104 < 0x1d; local_104 = local_104 + 1) {
        if (all_pnames[(ulong)local_104 - 2] == local_40) {
          bVar2 = true;
          break;
        }
      }
      goto LAB_012378ab;
    }
    (**(code **)(lStack_20 + 0xb00))(texture_invalid,local_40,storei + 2);
    bVar2 = ErrorsUtilities::CheckErrorAndLog
                      ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x500,
                       "glGetTextureParameterfv","pname is not an accepted value.");
    texture_buffer._2_1_ = bVar2 & texture_buffer._2_1_;
    (**(code **)(lStack_20 + 0xaf0))(texture_invalid,local_40,storeu + 2);
    bVar2 = ErrorsUtilities::CheckErrorAndLog
                      ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x500,
                       "glGetTextureParameterIiv","pname is not an accepted value.");
    texture_buffer._2_1_ = bVar2 & texture_buffer._2_1_;
    (**(code **)(lStack_20 + 0xaf8))(texture_invalid,local_40,&uStack_78);
    bVar2 = ErrorsUtilities::CheckErrorAndLog
                      ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x500,
                       "glGetTextureParameterIuiv","pname is not an accepted value.");
    texture_buffer._2_1_ = bVar2 & texture_buffer._2_1_;
    (**(code **)(lStack_20 + 0xb08))(texture_invalid,local_40,storeu + 2);
    bVar2 = ErrorsUtilities::CheckErrorAndLog
                      ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x500,
                       "glGetTextureParameteriv","pname is not an accepted value.");
    texture_buffer._2_1_ = bVar2 & texture_buffer._2_1_;
    (**(code **)(lStack_20 + 0xb00))(local_3c,0x1006,storei + 2);
    bVar2 = ErrorsUtilities::CheckErrorAndLog
                      ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x502,
                       "glGetTextureParameterfv",
                       "texture is not the name of an existing texture object.");
    texture_buffer._2_1_ = bVar2 & texture_buffer._2_1_;
    (**(code **)(lStack_20 + 0xaf0))(local_3c,0x1006,storeu + 2);
    bVar2 = ErrorsUtilities::CheckErrorAndLog
                      ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x502,
                       "glGetTextureParameterIiv",
                       "texture is not the name of an existing texture object.");
    texture_buffer._2_1_ = bVar2 & texture_buffer._2_1_;
    (**(code **)(lStack_20 + 0xaf8))(local_3c,0x1006,&uStack_78);
    bVar2 = ErrorsUtilities::CheckErrorAndLog
                      ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x502,
                       "glGetTextureParameterIuiv",
                       "texture is not the name of an existing texture object.");
    texture_buffer._2_1_ = bVar2 & texture_buffer._2_1_;
    (**(code **)(lStack_20 + 0xb08))(local_3c,0x1006,storeu + 2);
    bVar2 = ErrorsUtilities::CheckErrorAndLog
                      ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x502,
                       "glGetTextureParameteriv",
                       "texture is not the name of an existing texture object.");
    texture_buffer._2_1_ = bVar2 & texture_buffer._2_1_;
    (**(code **)(lStack_20 + 0xb00))(pname_invalid,0x1006,storei + 2);
    bVar2 = ErrorsUtilities::CheckErrorAndLog
                      ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x500,
                       "glGetTextureParameterfv",
                       "the effective target is not one of the supported texture targets (eg. TEXTURE_BUFFER)."
                      );
    texture_buffer._2_1_ = bVar2 & texture_buffer._2_1_;
    (**(code **)(lStack_20 + 0xaf0))(pname_invalid,0x1006,storeu + 2);
    bVar2 = ErrorsUtilities::CheckErrorAndLog
                      ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x500,
                       "glGetTextureParameterIiv",
                       "the effective target is not one of the supported texture targets (eg. TEXTURE_BUFFER)."
                      );
    texture_buffer._2_1_ = bVar2 & texture_buffer._2_1_;
    (**(code **)(lStack_20 + 0xaf8))(pname_invalid,0x1006,&uStack_78);
    bVar2 = ErrorsUtilities::CheckErrorAndLog
                      ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x500,
                       "glGetTextureParameterIuiv",
                       "the effective target is not one of the supported texture targets (eg. TEXTURE_BUFFER)."
                      );
    texture_buffer._2_1_ = bVar2 & texture_buffer._2_1_;
    (**(code **)(lStack_20 + 0xb08))(pname_invalid,0x1006,storeu + 2);
    bVar2 = ErrorsUtilities::CheckErrorAndLog
                      ((ErrorsUtilities *)this,(this->super_TestCase).m_context,0x500,
                       "glGetTextureParameteriv",
                       "the effective target is not one of the supported texture targets (eg. TEXTURE_BUFFER)."
                      );
    texture_buffer._2_1_ = (texture_buffer._2_1_ & 1 & bVar2) != 0;
    if (texture_invalid != 0) {
      (**(code **)(lStack_20 + 0x480))(1);
    }
    if (pname_invalid != 0) {
      (**(code **)(lStack_20 + 0x480))(1);
    }
    do {
      iVar3 = (**(code **)(lStack_20 + 0x800))();
    } while (iVar3 != 0);
    if ((texture_buffer._2_1_ & 1) == 0) {
      if ((texture_buffer._1_1_ & 1) == 0) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_INTERNAL_ERROR,"Error");
      }
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult ParameterErrorsTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Objects. */
	glw::GLuint texture_2D		= 0;
	glw::GLuint texture_buffer  = 0;
	glw::GLuint texture_invalid = 0;
	glw::GLenum pname_invalid   = 0;

	glw::GLfloat storef[4] = {};
	glw::GLint   storei[4] = {};
	glw::GLuint  storeu[4] = {};

	try
	{
		/* Preparations. */

		/* 2D texture */
		gl.createTextures(GL_TEXTURE_2D, 1, &texture_2D);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

		/* Buffer texture */
		gl.createTextures(GL_TEXTURE_BUFFER, 1, &texture_buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

		/* invalid texture */
		while (gl.isTexture(++texture_invalid))
			;

		/* invalid pname */
		glw::GLenum all_pnames[] = { GL_IMAGE_FORMAT_COMPATIBILITY_TYPE,
									 GL_TEXTURE_IMMUTABLE_FORMAT,
									 GL_TEXTURE_IMMUTABLE_LEVELS,
									 GL_TEXTURE_TARGET,
									 GL_TEXTURE_VIEW_MIN_LEVEL,
									 GL_TEXTURE_VIEW_NUM_LEVELS,
									 GL_TEXTURE_VIEW_MIN_LAYER,
									 GL_TEXTURE_VIEW_NUM_LAYERS,
									 GL_DEPTH_STENCIL_TEXTURE_MODE,
									 GL_DEPTH_COMPONENT,
									 GL_STENCIL_INDEX,
									 GL_TEXTURE_BASE_LEVEL,
									 GL_TEXTURE_BORDER_COLOR,
									 GL_TEXTURE_COMPARE_MODE,
									 GL_TEXTURE_COMPARE_FUNC,
									 GL_TEXTURE_LOD_BIAS,
									 GL_TEXTURE_MAG_FILTER,
									 GL_TEXTURE_MAX_LEVEL,
									 GL_TEXTURE_MAX_LOD,
									 GL_TEXTURE_MIN_FILTER,
									 GL_TEXTURE_MIN_LOD,
									 GL_TEXTURE_SWIZZLE_R,
									 GL_TEXTURE_SWIZZLE_G,
									 GL_TEXTURE_SWIZZLE_B,
									 GL_TEXTURE_SWIZZLE_A,
									 GL_TEXTURE_SWIZZLE_RGBA,
									 GL_TEXTURE_WRAP_S,
									 GL_TEXTURE_WRAP_T,
									 GL_TEXTURE_WRAP_R };

		glw::GLuint all_pnames_count = sizeof(all_pnames) / sizeof(all_pnames[0]);

		bool is_valid = true;

		while (is_valid)
		{
			is_valid = false;

			++pname_invalid;

			for (glw::GLuint i = 0; i < all_pnames_count; ++i)
			{
				if (all_pnames[i] == pname_invalid)
				{
					is_valid = true;

					break;
				}
			}
		}

		/* Tests. */

		/* Check that INVALID_ENUM is generated by glGetTextureParameter* if pname
		 is not an accepted value. */
		gl.getTextureParameterfv(texture_2D, pname_invalid, storef);
		is_ok &=
			CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glGetTextureParameterfv", "pname is not an accepted value.");

		gl.getTextureParameterIiv(texture_2D, pname_invalid, storei);
		is_ok &=
			CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glGetTextureParameterIiv", "pname is not an accepted value.");

		gl.getTextureParameterIuiv(texture_2D, pname_invalid, storeu);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glGetTextureParameterIuiv",
								  "pname is not an accepted value.");

		gl.getTextureParameteriv(texture_2D, pname_invalid, storei);
		is_ok &=
			CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glGetTextureParameteriv", "pname is not an accepted value.");

		/* Check that INVALID_OPERATION is generated by glGetTextureParameter* if
		 texture is not the name of an existing texture object. */
		gl.getTextureParameterfv(texture_invalid, GL_TEXTURE_TARGET, storef);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glGetTextureParameterfv",
								  "texture is not the name of an existing texture object.");

		gl.getTextureParameterIiv(texture_invalid, GL_TEXTURE_TARGET, storei);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glGetTextureParameterIiv",
								  "texture is not the name of an existing texture object.");

		gl.getTextureParameterIuiv(texture_invalid, GL_TEXTURE_TARGET, storeu);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glGetTextureParameterIuiv",
								  "texture is not the name of an existing texture object.");

		gl.getTextureParameteriv(texture_invalid, GL_TEXTURE_TARGET, storei);
		is_ok &= CheckErrorAndLog(m_context, GL_INVALID_OPERATION, "glGetTextureParameteriv",
								  "texture is not the name of an existing texture object.");

		/* Check that INVALID_ENUM error is generated if the effective target is
		 not one of the supported texture targets (eg. TEXTURE_BUFFER). */
		gl.getTextureParameterfv(texture_buffer, GL_TEXTURE_TARGET, storef);
		is_ok &=
			CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glGetTextureParameterfv",
							 "the effective target is not one of the supported texture targets (eg. TEXTURE_BUFFER).");

		gl.getTextureParameterIiv(texture_buffer, GL_TEXTURE_TARGET, storei);
		is_ok &=
			CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glGetTextureParameterIiv",
							 "the effective target is not one of the supported texture targets (eg. TEXTURE_BUFFER).");

		gl.getTextureParameterIuiv(texture_buffer, GL_TEXTURE_TARGET, storeu);
		is_ok &=
			CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glGetTextureParameterIuiv",
							 "the effective target is not one of the supported texture targets (eg. TEXTURE_BUFFER).");

		gl.getTextureParameteriv(texture_buffer, GL_TEXTURE_TARGET, storei);
		is_ok &=
			CheckErrorAndLog(m_context, GL_INVALID_ENUM, "glGetTextureParameteriv",
							 "the effective target is not one of the supported texture targets (eg. TEXTURE_BUFFER).");
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	if (texture_2D)
	{
		gl.deleteTextures(1, &texture_2D);
	}

	if (texture_buffer)
	{
		gl.deleteTextures(1, &texture_buffer);
	}

	while (GL_NO_ERROR != gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}